

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O3

void Gia_ManSimDelete(Gia_ManSim_t *p)

{
  Vec_Int_t *pVVar1;
  
  pVVar1 = p->vConsts;
  if (pVVar1 != (Vec_Int_t *)0x0) {
    if (pVVar1->pArray != (int *)0x0) {
      free(pVVar1->pArray);
      p->vConsts->pArray = (int *)0x0;
      pVVar1 = p->vConsts;
      if (pVVar1 == (Vec_Int_t *)0x0) goto LAB_0071d8d5;
    }
    free(pVVar1);
    p->vConsts = (Vec_Int_t *)0x0;
  }
LAB_0071d8d5:
  pVVar1 = p->vCis2Ids;
  if (pVVar1 != (Vec_Int_t *)0x0) {
    if (pVVar1->pArray != (int *)0x0) {
      free(pVVar1->pArray);
      p->vCis2Ids->pArray = (int *)0x0;
      pVVar1 = p->vCis2Ids;
      if (pVVar1 == (Vec_Int_t *)0x0) goto LAB_0071d911;
    }
    free(pVVar1);
    p->vCis2Ids = (Vec_Int_t *)0x0;
  }
LAB_0071d911:
  Gia_ManStopP(&p->pAig);
  if (p->pDataSim != (uint *)0x0) {
    free(p->pDataSim);
    p->pDataSim = (uint *)0x0;
  }
  if (p->pDataSimCis != (uint *)0x0) {
    free(p->pDataSimCis);
    p->pDataSimCis = (uint *)0x0;
  }
  if (p->pDataSimCos != (uint *)0x0) {
    free(p->pDataSimCos);
  }
  free(p);
  return;
}

Assistant:

void Gia_ManSimDelete( Gia_ManSim_t * p )
{
    Vec_IntFreeP( &p->vConsts );
    Vec_IntFreeP( &p->vCis2Ids );
    Gia_ManStopP( &p->pAig );
    ABC_FREE( p->pDataSim );
    ABC_FREE( p->pDataSimCis );
    ABC_FREE( p->pDataSimCos );
    ABC_FREE( p );
}